

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O3

void __thiscall
soul::SanityCheckPass::PostResolutionChecks::visit(PostResolutionChecks *this,IfStatement *i)

{
  Expression *pEVar1;
  CompileMessage CStack_48;
  
  if (i->isConstIf != true) {
    ASTVisitor::visit(&this->super_ASTVisitor,i);
    return;
  }
  pEVar1 = (i->condition).object;
  CompileMessageHelpers::createMessage<>(&CStack_48,syntax,error,"Expected a constant value");
  AST::Context::throwError(&(pEVar1->super_Statement).super_ASTObject.context,&CStack_48,false);
}

Assistant:

void visit (AST::IfStatement& i) override
        {
            if (i.isConstIf)
                i.condition->context.throwError (Errors::expectedConstant());

            super::visit (i);
        }